

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlglvideo.cpp
# Opt level: O0

void __thiscall
SDLGLFB::SDLGLFB(SDLGLFB *this,void *param_1,int width,int height,int param_4,int param_5,
                bool fullscreen)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  SDL_Window *pSVar7;
  SDL_GLContext pvVar8;
  undefined8 uVar9;
  FString local_48;
  FString caption;
  int i;
  bool fullscreen_local;
  int param_5_local;
  int param_4_local;
  int height_local;
  int width_local;
  void *param_1_local;
  SDLGLFB *this_local;
  
  DFrameBuffer::DFrameBuffer(&this->super_DFrameBuffer,width,height);
  (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b60e30;
  this->m_Lock = 0;
  this->UpdatePending = false;
  bVar1 = SDLGLVideo::InitHardware((SDLGLVideo *)Video,false,0);
  if (bVar1) {
    FString::FString(&local_48);
    pcVar5 = GetVersionString();
    pcVar6 = GetGitTime();
    FString::Format(&local_48,"GZDOOM %s (%s)",pcVar5,pcVar6);
    pcVar5 = FString::operator_cast_to_char_(&local_48);
    uVar2 = FIntCVar::operator_cast_to_int(&vid_adapter);
    uVar3 = FIntCVar::operator_cast_to_int(&vid_adapter);
    uVar9 = 2;
    if (fullscreen) {
      uVar9 = 0x1003;
    }
    pSVar7 = (SDL_Window *)
             SDL_CreateWindow(pcVar5,uVar2 | 0x1fff0000,uVar3 | 0x1fff0000,width,height,uVar9);
    this->Screen = pSVar7;
    if (this->Screen != (SDL_Window *)0x0) {
      pvVar8 = (SDL_GLContext)SDL_GL_CreateContext(this->Screen);
      this->GLContext = pvVar8;
      if (this->GLContext != (SDL_GLContext)0x0) {
        iVar4 = SDL_GetWindowGammaRamp
                          (this->Screen,this->m_origGamma,this->m_origGamma + 1,
                           this->m_origGamma + 2);
        this->m_supportsGamma = iVar4 != -1;
      }
    }
    FString::~FString(&local_48);
  }
  else {
    FIntCVar::operator=(&vid_renderer,0);
  }
  return;
}

Assistant:

SDLGLFB::SDLGLFB (void *, int width, int height, int, int, bool fullscreen)
	: DFrameBuffer (width, height)
{
	int i;
	
	m_Lock=0;

	UpdatePending = false;
	
	if (!static_cast<SDLGLVideo*>(Video)->InitHardware(false, 0))
	{
		vid_renderer = 0;
		return;
	}

	FString caption;
	caption.Format(GAMESIG " %s (%s)", GetVersionString(), GetGitTime());
	Screen = SDL_CreateWindow (caption,
		SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter), SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter),
		width, height, (fullscreen ? SDL_WINDOW_FULLSCREEN_DESKTOP : 0)|SDL_WINDOW_OPENGL);

	if (Screen == NULL)
		return;

	GLContext = SDL_GL_CreateContext(Screen);
	if (GLContext == NULL)
		return;

	m_supportsGamma = -1 != SDL_GetWindowGammaRamp(Screen, m_origGamma[0], m_origGamma[1], m_origGamma[2]);
}